

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns_handler.cpp
# Opt level: O2

int ot::commissioner::HandleRecord
              (sockaddr *aFrom,mdns_entry_type_t aEntry,uint16_t aType,uint16_t aRclass,
              uint32_t aTtl,void *aData,size_t aSize,size_t aOffset,size_t aLength,
              void *aBorderAgent)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  uchar uVar5;
  unsigned_short uVar6;
  uint uVar7;
  char *pcVar8;
  size_t sVar9;
  unsigned_long uVar10;
  Timestamp TVar11;
  time_t tVar12;
  char *pcVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  mdns_string_t *extraout_RDX;
  mdns_string_t *aString;
  mdns_string_t *aString_00;
  mdns_string_t *extraout_RDX_00;
  format_string_checker<char> *extraout_RDX_01;
  format_string_checker<char> *extraout_RDX_02;
  format_string_checker<char> *extraout_RDX_03;
  format_string_checker<char> *extraout_RDX_04;
  format_string_checker<char> *extraout_RDX_05;
  format_string_checker<char> *extraout_RDX_06;
  format_string_checker<char> *extraout_RDX_07;
  format_string_checker<char> *extraout_RDX_08;
  format_string_checker<char> *extraout_RDX_09;
  format_string_checker<char> *extraout_RDX_10;
  format_string_checker<char> *extraout_RDX_11;
  format_string_checker<char> *extraout_RDX_12;
  format_string_checker<char> *extraout_RDX_13;
  format_string_checker<char> *extraout_RDX_14;
  format_string_checker<char> *extraout_RDX_15;
  format_string_checker<char> *extraout_RDX_16;
  format_string_checker<char> *pfVar17;
  type tVar18;
  commissioner *this;
  string *this_00;
  sockaddr_in6 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar19;
  bool bVar20;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  mdns_string_t mVar21;
  undefined1 local_1358 [8];
  char *pcStack_1350;
  undefined1 local_1348 [24];
  code *local_1330;
  code *local_1328;
  Error *local_1320;
  writer write_1;
  anon_union_16_3_a3f0114d_for___in6_u aStack_1310;
  sockaddr_in6 addr;
  ByteArray binaryValue;
  undefined1 local_12c0 [40];
  writer write;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1288;
  string fromAddrStr;
  string value;
  Address fromAddr;
  string entryType;
  char nameBuffer [256];
  sockaddr_storage fromAddrStorage;
  mdns_record_srv_t server;
  undefined8 local_1020 [510];
  
  fromAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fromAddrStr._M_dataplus._M_p = (pointer)&fromAddrStr.field_2;
  fromAddrStr._M_string_length = 0;
  fromAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fromAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fromAddrStr.field_2._M_local_buf[0] = '\0';
  entryType._M_dataplus._M_p = (pointer)&entryType.field_2;
  entryType._M_string_length = 0;
  entryType.field_2._M_local_buf[0] = '\0';
  fromAddrStorage.ss_family = aFrom->sa_family;
  fromAddrStorage.__ss_padding[0] = aFrom->sa_data[0];
  fromAddrStorage.__ss_padding[1] = aFrom->sa_data[1];
  fromAddrStorage.__ss_padding[2] = aFrom->sa_data[2];
  fromAddrStorage.__ss_padding[3] = aFrom->sa_data[3];
  fromAddrStorage.__ss_padding[4] = aFrom->sa_data[4];
  fromAddrStorage.__ss_padding[5] = aFrom->sa_data[5];
  fromAddrStorage.__ss_padding._6_8_ = *(undefined8 *)(aFrom->sa_data + 6);
  aVar19 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )aData;
  Address::Set((Error *)&server,&fromAddr,&fromAddrStorage);
  local_1320 = (Error *)((long)aBorderAgent + 0x178);
  uVar4 = server._0_4_;
  std::__cxx11::string::~string((string *)&server.name);
  if (uVar4 != 0) {
    server._0_8_ = server._0_8_ & 0xffffffff00000000;
    server.name.str._0_4_ = 0x1f4865;
    server.name.str._4_4_ = 0;
    server.name.length._0_4_ = 0x27;
    server.name.length._4_4_ = 0;
    pcVar8 = "invalid source address of mDNS response";
    write.handler_ = (format_string_checker<char> *)&server;
    while (pcVar8 != "") {
      cVar1 = *pcVar8;
      pcVar13 = pcVar8;
      while (cVar1 != '{') {
        pcVar13 = pcVar13 + 1;
        if (pcVar13 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar8,"");
          goto LAB_0015b719;
        }
        cVar1 = *pcVar13;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar8,pcVar13);
      pcVar8 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar13,"",(format_string_checker<char> *)&server);
    }
LAB_0015b719:
    args.field_1.values_ = aVar19.values_;
    args.desc_ = (unsigned_long_long)&server;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_12c0,(v10 *)"invalid source address of mDNS response",
               (string_view)ZEXT816(0x27),args);
    local_1358._0_4_ = 8;
    std::__cxx11::string::string((string *)&pcStack_1350,(string *)local_12c0);
    Error::operator=(local_1320,(Error *)local_1358);
    std::__cxx11::string::~string((string *)&pcStack_1350);
    this_00 = (string *)local_12c0;
LAB_0015b775:
    std::__cxx11::string::~string(this_00);
    goto LAB_0015c1a5;
  }
  Address::ToString_abi_cxx11_((string *)&server,&fromAddr);
  std::__cxx11::string::operator=((string *)&fromAddrStr,(string *)&server);
  std::__cxx11::string::~string((string *)&server);
  std::__cxx11::string::assign((char *)&entryType);
  if (aType == 1) {
    local_1288._M_local_buf[0] = '\0';
    write.handler_ = (format_string_checker<char> *)&local_1288;
    mdns_record_parse_a(aData,aSize,aOffset,aLength,(sockaddr_in *)&addr);
    server._0_8_ = addr._0_8_;
    server.name.str._0_4_ = addr.sin6_addr.__in6_u.__u6_addr32[0];
    server.name.str._4_4_ = addr.sin6_addr.__in6_u.__u6_addr32[1];
    Address::Set((Error *)local_1358,&fromAddr,(sockaddr_storage *)&server);
    tVar18 = local_1358._0_4_;
    std::__cxx11::string::~string((string *)&pcStack_1350);
    if (tVar18 == none_type) {
      Address::ToString_abi_cxx11_((string *)local_1358,&fromAddr);
      std::__cxx11::string::operator=((string *)&write,(string *)local_1358);
      std::__cxx11::string::~string((string *)local_1358);
      if ((*(byte *)((long)aBorderAgent + 0x170) & 1) == 0) {
        std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 8));
LAB_0015c16c:
        *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 1;
      }
    }
    else {
      local_1358._0_4_ = string_type;
      pcStack_1350 = "invalid IPv4 address in A record from {}";
      local_1348._0_8_ = (pointer)0x28;
      local_1348._8_8_ = 0x100000000;
      local_1330 = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar8 = "invalid IPv4 address in A record from {}";
      local_1348._16_8_ = (format_string_checker<char> *)local_1358;
      write_1.handler_ = (format_string_checker<char> *)local_1358;
      while (pcVar8 != "") {
        cVar1 = *pcVar8;
        pcVar13 = pcVar8;
        while (cVar1 != '{') {
          pcVar13 = pcVar13 + 1;
          if (pcVar13 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&write_1,pcVar8,"");
            goto LAB_0015c05f;
          }
          cVar1 = *pcVar13;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&write_1,pcVar8,pcVar13);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar13,"",(format_string_checker<char> *)local_1358);
      }
LAB_0015c05f:
      local_1358 = (undefined1  [8])fromAddrStr._M_dataplus._M_p;
      pcStack_1350 = (char *)fromAddrStr._M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x28;
      args_01.field_1.args_ = aVar19.args_;
      args_01.desc_ = (unsigned_long_long)local_1358;
      ::fmt::v10::vformat_abi_cxx11_
                (&value,(v10 *)"invalid IPv4 address in A record from {}",fmt_00,args_01);
      local_12c0._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_12c0 + 8),(string *)&value);
LAB_0015c0a9:
      Error::operator=(local_1320,(Error *)local_12c0);
      std::__cxx11::string::~string((string *)(local_12c0 + 8));
      std::__cxx11::string::~string((string *)&value);
    }
    std::__cxx11::string::~string((string *)&write);
    if (tVar18 != none_type) goto LAB_0015c1a5;
  }
  else if (aType == 0x21) {
    mdns_record_parse_srv(&server,aData,aSize,aOffset,aLength,nameBuffer,0x100);
    *(uint16_t *)((long)aBorderAgent + 0x28) = server.port;
    *(byte *)((long)aBorderAgent + 0x170) = *(byte *)((long)aBorderAgent + 0x170) | 2;
  }
  else if (aType == 0x10) {
    aVar19 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )0x80;
    sVar9 = mdns_record_parse_txt(aData,aSize,aOffset,aLength,(mdns_record_txt_t *)&server,0x80);
    this = (commissioner *)&server.name.length;
    aString = extraout_RDX;
    while (bVar20 = sVar9 != 0, sVar9 = sVar9 - 1, bVar20) {
      ToString_abi_cxx11_((string *)&write,this + -0x10,aString);
      ToString_abi_cxx11_(&value,this,aString_00);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&binaryValue,*(char **)this,
                 *(char **)this + *(long *)(this + 8),(allocator_type *)local_1358);
      bVar20 = std::operator==((string *)&write,"rv");
      if (bVar20) {
        bVar20 = std::operator==(&value,"1");
        if (bVar20) goto LAB_0015bc44;
        local_1358 = (undefined1  [8])0xd0000000d;
        pcStack_1350 = "value of TXT Key \'rv\' is {} but not 1 from {}";
        local_1348._0_8_ = 0x2d;
        local_1348._8_8_ = 0x200000000;
        local_1348._16_8_ = local_1358;
        local_1330 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_1328 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar8 = "value of TXT Key \'rv\' is {} but not 1 from {}";
        write_1.handler_ = (format_string_checker<char> *)local_1348._16_8_;
        while (pcVar8 != "") {
          cVar1 = *pcVar8;
          pcVar13 = pcVar8;
          while (cVar1 != '{') {
            pcVar13 = pcVar13 + 1;
            if (pcVar13 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&write_1,pcVar8,"");
              goto LAB_0015c296;
            }
            cVar1 = *pcVar13;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&write_1,pcVar8,pcVar13);
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                             (pcVar13,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_1358);
        }
LAB_0015c296:
        local_1358 = (undefined1  [8])value._M_dataplus._M_p;
        pcStack_1350 = (char *)value._M_string_length;
        local_1348._0_8_ = fromAddrStr._M_dataplus._M_p;
        local_1348._8_8_ = fromAddrStr._M_string_length;
        fmt_01.size_ = 0xdd;
        fmt_01.data_ = (char *)0x2d;
        args_02.field_1.args_ = aVar19.args_;
        args_02.desc_ = (unsigned_long_long)local_1358;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&addr,(v10 *)"value of TXT Key \'rv\' is {} but not 1 from {}",fmt_01,
                   args_02);
        local_12c0._0_4_ = kBadFormat;
        std::__cxx11::string::string((string *)(local_12c0 + 8),(string *)&addr);
        Error::operator=(local_1320,(Error *)local_12c0);
        std::__cxx11::string::~string((string *)(local_12c0 + 8));
        this_01 = &addr;
LAB_0015c6a2:
        std::__cxx11::string::~string((string *)this_01);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::string::~string((string *)&value);
        this_00 = (string *)&write;
        goto LAB_0015b775;
      }
      bVar20 = std::operator==((string *)&write,"dd");
      if (bVar20) {
        if ((long)binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != 8) {
          local_1358._0_4_ = 0xd;
          pcStack_1350 = "value of TXT Key \'dd\' is invalid: value={}";
          local_1348._0_8_ = (pointer)0x2a;
          local_1348._8_8_ = 0x100000000;
          pfVar17 = (format_string_checker<char> *)local_1358;
          local_1330 = ::fmt::v10::detail::
                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar8 = "value of TXT Key \'dd\' is invalid: value={}";
          local_1348._16_8_ = pfVar17;
          write_1.handler_ = pfVar17;
          while (pcVar8 != "") {
            cVar1 = *pcVar8;
            pcVar13 = pcVar8;
            while (cVar1 != '{') {
              pcVar13 = pcVar13 + 1;
              if (pcVar13 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()(&write_1,pcVar8,"");
                pfVar17 = extraout_RDX_02;
                goto LAB_0015c3b7;
              }
              cVar1 = *pcVar13;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&write_1,pcVar8,pcVar13);
            pcVar8 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar13,"",(format_string_checker<char> *)local_1358);
            pfVar17 = extraout_RDX_01;
          }
LAB_0015c3b7:
          utils::Hex_abi_cxx11_((string *)local_1358,(utils *)&binaryValue,(ByteArray *)pfVar17);
          write_1.handler_ = (format_string_checker<char> *)local_1358;
          fmt_02.size_ = 0xd;
          fmt_02.data_ = (char *)0x2a;
          args_03.field_1.args_ = aVar19.args_;
          args_03.desc_ = (unsigned_long_long)&write_1;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&addr,(v10 *)"value of TXT Key \'dd\' is invalid: value={}",fmt_02,
                     args_03);
          local_12c0._0_4_ = kBadFormat;
          std::__cxx11::string::string((string *)(local_12c0 + 8),(string *)&addr);
          Error::operator=(local_1320,(Error *)local_12c0);
          std::__cxx11::string::~string((string *)(local_12c0 + 8));
          std::__cxx11::string::~string((string *)&addr);
          this_01 = (sockaddr_in6 *)local_1358;
          goto LAB_0015c6a2;
        }
        uVar7 = 0x8000;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)aBorderAgent + 0x30),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&binaryValue);
      }
      else {
        bVar20 = std::operator==((string *)&write,"tv");
        if (bVar20) {
          std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 0x48));
          uVar7 = 4;
        }
        else {
          bVar20 = std::operator==((string *)&write,"sb");
          if (bVar20) {
            if ((long)binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != 4) {
              local_1358 = (undefined1  [8])0xd0000000d;
              pcStack_1350 = "value of TXT Key \'sb\' is invalid: value={} from {}";
              local_1348._0_8_ = 0x32;
              local_1348._8_8_ = 0x200000000;
              pfVar17 = (format_string_checker<char> *)local_1358;
              local_1330 = ::fmt::v10::detail::
                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              local_1328 = ::fmt::v10::detail::
                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              pcVar8 = "value of TXT Key \'sb\' is invalid: value={} from {}";
              local_1348._16_8_ = pfVar17;
              write_1.handler_ = pfVar17;
              while (pcVar8 != "") {
                cVar1 = *pcVar8;
                pcVar13 = pcVar8;
                while (cVar1 != '{') {
                  pcVar13 = pcVar13 + 1;
                  if (pcVar13 == "") {
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()((writer *)&write_1,pcVar8,"");
                    pfVar17 = extraout_RDX_04;
                    goto LAB_0015c4f2;
                  }
                  cVar1 = *pcVar13;
                }
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&write_1,pcVar8,pcVar13);
                pcVar8 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                   (pcVar13,"",
                                    (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_1358);
                pfVar17 = extraout_RDX_03;
              }
LAB_0015c4f2:
              utils::Hex_abi_cxx11_((string *)&write_1,(utils *)&binaryValue,(ByteArray *)pfVar17);
              local_1358 = (undefined1  [8])write_1.handler_;
              pcStack_1350 = (char *)aStack_1310._0_8_;
              local_1348._0_8_ = fromAddrStr._M_dataplus._M_p;
              local_1348._8_8_ = fromAddrStr._M_string_length;
              fmt_03.size_ = 0xdd;
              fmt_03.data_ = (char *)0x32;
              args_04.field_1.args_ = aVar19.args_;
              args_04.desc_ = (unsigned_long_long)local_1358;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&addr,
                         (v10 *)"value of TXT Key \'sb\' is invalid: value={} from {}",fmt_03,
                         args_04);
              local_12c0._0_4_ = kBadFormat;
              std::__cxx11::string::string((string *)(local_12c0 + 8),(string *)&addr);
LAB_0015c679:
              Error::operator=(local_1320,(Error *)local_12c0);
LAB_0015c68e:
              std::__cxx11::string::~string((string *)(local_12c0 + 8));
              std::__cxx11::string::~string((string *)&addr);
              this_01 = (sockaddr_in6 *)&write_1;
              goto LAB_0015c6a2;
            }
            uVar14 = binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[3] & 7;
            uVar3 = (ushort)*(undefined4 *)((long)aBorderAgent + 0x68);
            *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xfff8 | uVar14;
            uVar15 = binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[3] & 0x18;
            *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xffe0 | uVar14 | uVar15;
            uVar16 = binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[3] & 0x60;
            *(ushort *)((long)aBorderAgent + 0x68) = uVar3 & 0xff80 | uVar14 | uVar15 | uVar16;
            bVar2 = binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[3];
            *(ushort *)((long)aBorderAgent + 0x68) =
                 uVar3 & 0xff00 | uVar14 | uVar15 | uVar16 | bVar2 & 0xff80;
            *(ushort *)((long)aBorderAgent + 0x68) =
                 uVar3 & 0xfe00 | uVar14 | uVar15 | uVar16 | bVar2 & 0xff80 |
                 (binaryValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start[2] & 1) << 8;
            uVar7 = 8;
          }
          else {
            bVar20 = std::operator==((string *)&write,"nn");
            if (bVar20) {
              std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 0x70));
              uVar7 = 0x10;
            }
            else {
              bVar20 = std::operator==((string *)&write,"xp");
              if (bVar20) {
                if ((long)binaryValue.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)binaryValue.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start != 8) {
                  local_1358 = (undefined1  [8])0xd0000000d;
                  pcStack_1350 = "value of TXT Key \'xp\' is invalid: value={} from {}";
                  local_1348._0_8_ = 0x32;
                  local_1348._8_8_ = 0x200000000;
                  pfVar17 = (format_string_checker<char> *)local_1358;
                  local_1330 = ::fmt::v10::detail::
                               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                  ;
                  local_1328 = ::fmt::v10::detail::
                               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                  ;
                  pcVar8 = "value of TXT Key \'xp\' is invalid: value={} from {}";
                  local_1348._16_8_ = pfVar17;
                  write_1.handler_ = pfVar17;
                  while (pcVar8 != "") {
                    cVar1 = *pcVar8;
                    pcVar13 = pcVar8;
                    while (cVar1 != '{') {
                      pcVar13 = pcVar13 + 1;
                      if (pcVar13 == "") {
                        ::fmt::v10::detail::
                        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::writer::operator()((writer *)&write_1,pcVar8,"");
                        pfVar17 = extraout_RDX_06;
                        goto LAB_0015c613;
                      }
                      cVar1 = *pcVar13;
                    }
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()((writer *)&write_1,pcVar8,pcVar13);
                    pcVar8 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                       (pcVar13,"",
                                        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_1358);
                    pfVar17 = extraout_RDX_05;
                  }
LAB_0015c613:
                  utils::Hex_abi_cxx11_
                            ((string *)&write_1,(utils *)&binaryValue,(ByteArray *)pfVar17);
                  local_1358 = (undefined1  [8])write_1.handler_;
                  pcStack_1350 = (char *)aStack_1310._0_8_;
                  local_1348._0_8_ = fromAddrStr._M_dataplus._M_p;
                  local_1348._8_8_ = fromAddrStr._M_string_length;
                  fmt_04.size_ = 0xdd;
                  fmt_04.data_ = (char *)0x32;
                  args_05.field_1.args_ = aVar19.args_;
                  args_05.desc_ = (unsigned_long_long)local_1358;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)&addr,
                             (v10 *)"value of TXT Key \'xp\' is invalid: value={} from {}",fmt_04,
                             args_05);
                  local_12c0._0_4_ = kBadFormat;
                  std::__cxx11::string::string((string *)(local_12c0 + 8),(string *)&addr);
                  goto LAB_0015c679;
                }
                uVar10 = utils::Decode<unsigned_long>(&binaryValue);
                *(unsigned_long *)((long)aBorderAgent + 0x90) = uVar10;
                uVar7 = 0x20;
              }
              else {
                bVar20 = std::operator==((string *)&write,"vn");
                if (bVar20) {
                  std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 0x98));
                  uVar7 = 0x40;
                }
                else {
                  bVar20 = std::operator==((string *)&write,"mn");
                  if (bVar20) {
                    uVar7 = 0x80;
                    std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 0xb8));
                  }
                  else {
                    bVar20 = std::operator==((string *)&write,"at");
                    if (bVar20) {
                      if ((long)binaryValue.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)binaryValue.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != 8) {
                        local_1358 = (undefined1  [8])0xd0000000d;
                        pcStack_1350 = "value of TXT Key \'at\' is invalid: value={} from {}";
                        local_1348._0_8_ = 0x32;
                        local_1348._8_8_ = 0x200000000;
                        pfVar17 = (format_string_checker<char> *)local_1358;
                        local_1330 = ::fmt::v10::detail::
                                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                        ;
                        local_1328 = ::fmt::v10::detail::
                                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                        ;
                        pcVar8 = "value of TXT Key \'at\' is invalid: value={} from {}";
                        local_1348._16_8_ = pfVar17;
                        write_1.handler_ = pfVar17;
                        while (pcVar8 != "") {
                          cVar1 = *pcVar8;
                          pcVar13 = pcVar8;
                          while (cVar1 != '{') {
                            pcVar13 = pcVar13 + 1;
                            if (pcVar13 == "") {
                              ::fmt::v10::detail::
                              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::writer::operator()((writer *)&write_1,pcVar8,"");
                              pfVar17 = extraout_RDX_08;
                              goto LAB_0015c784;
                            }
                            cVar1 = *pcVar13;
                          }
                          ::fmt::v10::detail::
                          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::writer::operator()((writer *)&write_1,pcVar8,pcVar13);
                          pcVar8 = ::fmt::v10::detail::
                                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                             (pcVar13,"",
                                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_1358);
                          pfVar17 = extraout_RDX_07;
                        }
LAB_0015c784:
                        utils::Hex_abi_cxx11_
                                  ((string *)&write_1,(utils *)&binaryValue,(ByteArray *)pfVar17);
                        local_1358 = (undefined1  [8])write_1.handler_;
                        pcStack_1350 = (char *)aStack_1310._0_8_;
                        local_1348._0_8_ = fromAddrStr._M_dataplus._M_p;
                        local_1348._8_8_ = fromAddrStr._M_string_length;
                        fmt_05.size_ = 0xdd;
                        fmt_05.data_ = (char *)0x32;
                        args_06.field_1.args_ = aVar19.args_;
                        args_06.desc_ = (unsigned_long_long)local_1358;
                        ::fmt::v10::vformat_abi_cxx11_
                                  ((string *)&addr,
                                   (v10 *)"value of TXT Key \'at\' is invalid: value={} from {}",
                                   fmt_05,args_06);
                        local_12c0._0_4_ = kBadFormat;
                        std::__cxx11::string::string((string *)(local_12c0 + 8),(string *)&addr);
                        goto LAB_0015c679;
                      }
                      uVar10 = utils::Decode<unsigned_long>(&binaryValue);
                      TVar11 = Timestamp::Decode(uVar10);
                      *(Timestamp *)((long)aBorderAgent + 0xd8) = TVar11;
                      uVar7 = 0x100;
                    }
                    else {
                      bVar20 = std::operator==((string *)&write,"pt");
                      if (bVar20) {
                        if ((long)binaryValue.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)binaryValue.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start != 4) {
                          local_1358 = (undefined1  [8])0xd0000000d;
                          pcStack_1350 = "value of TXT Key \'pt\' is invalid: value={} from {}";
                          local_1348._0_8_ = 0x32;
                          local_1348._8_8_ = 0x200000000;
                          pfVar17 = (format_string_checker<char> *)local_1358;
                          local_1330 = ::fmt::v10::detail::
                                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                          ;
                          local_1328 = ::fmt::v10::detail::
                                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                          ;
                          pcVar8 = "value of TXT Key \'pt\' is invalid: value={} from {}";
                          local_1348._16_8_ = pfVar17;
                          write_1.handler_ = pfVar17;
                          while (pcVar8 != "") {
                            cVar1 = *pcVar8;
                            pcVar13 = pcVar8;
                            while (cVar1 != '{') {
                              pcVar13 = pcVar13 + 1;
                              if (pcVar13 == "") {
                                ::fmt::v10::detail::
                                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::writer::operator()((writer *)&write_1,pcVar8,"");
                                pfVar17 = extraout_RDX_10;
                                goto LAB_0015c8a5;
                              }
                              cVar1 = *pcVar13;
                            }
                            ::fmt::v10::detail::
                            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::writer::operator()((writer *)&write_1,pcVar8,pcVar13);
                            pcVar8 = ::fmt::v10::detail::
                                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                               (pcVar13,"",
                                                (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)local_1358);
                            pfVar17 = extraout_RDX_09;
                          }
LAB_0015c8a5:
                          utils::Hex_abi_cxx11_
                                    ((string *)&write_1,(utils *)&binaryValue,(ByteArray *)pfVar17);
                          local_1358 = (undefined1  [8])write_1.handler_;
                          pcStack_1350 = (char *)aStack_1310._0_8_;
                          local_1348._0_8_ = fromAddrStr._M_dataplus._M_p;
                          local_1348._8_8_ = fromAddrStr._M_string_length;
                          fmt_06.size_ = 0xdd;
                          fmt_06.data_ = (char *)0x32;
                          args_07.field_1.args_ = aVar19.args_;
                          args_07.desc_ = (unsigned_long_long)local_1358;
                          ::fmt::v10::vformat_abi_cxx11_
                                    ((string *)&addr,
                                     (v10 *)"value of TXT Key \'pt\' is invalid: value={} from {}",
                                     fmt_06,args_07);
                          local_12c0._0_4_ = kBadFormat;
                          std::__cxx11::string::string((string *)(local_12c0 + 8),(string *)&addr);
                          goto LAB_0015cc62;
                        }
                        uVar7 = utils::Decode<unsigned_int>(&binaryValue);
                        *(uint *)((long)aBorderAgent + 0xe0) = uVar7;
                        uVar7 = 0x200;
                      }
                      else {
                        bVar20 = std::operator==((string *)&write,"vd");
                        if (bVar20) {
                          uVar7 = 0x400;
                          std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 0xe8));
                        }
                        else {
                          bVar20 = std::operator==((string *)&write,"vo");
                          if (bVar20) {
                            if ((long)binaryValue.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)binaryValue.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start != 3) {
                              local_1358 = (undefined1  [8])0xd0000000d;
                              pcStack_1350 = "value of TXT Key \'vo\' is invalid: value={} from {}";
                              local_1348._0_8_ = 0x32;
                              local_1348._8_8_ = 0x200000000;
                              pfVar17 = (format_string_checker<char> *)local_1358;
                              local_1330 = ::fmt::v10::detail::
                                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                              ;
                              local_1328 = ::fmt::v10::detail::
                                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                              ;
                              pcVar8 = "value of TXT Key \'vo\' is invalid: value={} from {}";
                              local_1348._16_8_ = pfVar17;
                              write_1.handler_ = pfVar17;
                              while (pcVar8 != "") {
                                cVar1 = *pcVar8;
                                pcVar13 = pcVar8;
                                while (cVar1 != '{') {
                                  pcVar13 = pcVar13 + 1;
                                  if (pcVar13 == "") {
                                    ::fmt::v10::detail::
                                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::writer::operator()((writer *)&write_1,pcVar8,"");
                                    pfVar17 = extraout_RDX_12;
                                    goto LAB_0015c9c3;
                                  }
                                  cVar1 = *pcVar13;
                                }
                                ::fmt::v10::detail::
                                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::writer::operator()((writer *)&write_1,pcVar8,pcVar13);
                                pcVar8 = ::fmt::v10::detail::
                                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                                   (pcVar13,"",
                                                    (
                                                  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1358);
                                pfVar17 = extraout_RDX_11;
                              }
LAB_0015c9c3:
                              utils::Hex_abi_cxx11_
                                        ((string *)&write_1,(utils *)&binaryValue,
                                         (ByteArray *)pfVar17);
                              local_1358 = (undefined1  [8])write_1.handler_;
                              pcStack_1350 = (char *)aStack_1310._0_8_;
                              local_1348._0_8_ = fromAddrStr._M_dataplus._M_p;
                              local_1348._8_8_ = fromAddrStr._M_string_length;
                              fmt_07.size_ = 0xdd;
                              fmt_07.data_ = (char *)0x32;
                              args_08.field_1.args_ = aVar19.args_;
                              args_08.desc_ = (unsigned_long_long)local_1358;
                              ::fmt::v10::vformat_abi_cxx11_
                                        ((string *)&addr,
                                         (v10 *)
                                         "value of TXT Key \'vo\' is invalid: value={} from {}",
                                         fmt_07,args_08);
                              local_12c0._0_4_ = kBadFormat;
                              std::__cxx11::string::string
                                        ((string *)(local_12c0 + 8),(string *)&addr);
                              goto LAB_0015cc62;
                            }
                            uVar7 = 0x800;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       ((long)aBorderAgent + 0x108),
                                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &binaryValue);
                          }
                          else {
                            bVar20 = std::operator==((string *)&write,"dn");
                            if (bVar20) {
                              uVar7 = 0x1000;
                              std::__cxx11::string::_M_assign
                                        ((string *)((long)aBorderAgent + 0x120));
                            }
                            else {
                              bVar20 = std::operator==((string *)&write,"sq");
                              if (bVar20) {
                                if ((long)binaryValue.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)binaryValue.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start != 1) {
                                  local_1358 = (undefined1  [8])0xd0000000d;
                                  pcStack_1350 = 
                                  "[mDNS] value of TXT Key \'sq\' is invalid: {} from {}";
                                  local_1348._0_8_ = 0x33;
                                  local_1348._8_8_ = 0x200000000;
                                  pfVar17 = (format_string_checker<char> *)local_1358;
                                  local_1330 = ::fmt::v10::detail::
                                               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                                  ;
                                  local_1328 = ::fmt::v10::detail::
                                               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                                  ;
                                  pcVar8 = "[mDNS] value of TXT Key \'sq\' is invalid: {} from {}";
                                  local_1348._16_8_ = pfVar17;
                                  write_1.handler_ = pfVar17;
                                  while (pcVar8 != "") {
                                    cVar1 = *pcVar8;
                                    pcVar13 = pcVar8;
                                    while (cVar1 != '{') {
                                      pcVar13 = pcVar13 + 1;
                                      if (pcVar13 == "") {
                                        ::fmt::v10::detail::
                                        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::writer::operator()((writer *)&write_1,pcVar8,"");
                                        pfVar17 = extraout_RDX_14;
                                        goto LAB_0015cae1;
                                      }
                                      cVar1 = *pcVar13;
                                    }
                                    ::fmt::v10::detail::
                                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::writer::operator()((writer *)&write_1,pcVar8,pcVar13);
                                    pcVar8 = ::fmt::v10::detail::
                                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                                       (pcVar13,"",
                                                        (
                                                  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1358);
                                    pfVar17 = extraout_RDX_13;
                                  }
LAB_0015cae1:
                                  utils::Hex_abi_cxx11_
                                            ((string *)&write_1,(utils *)&binaryValue,
                                             (ByteArray *)pfVar17);
                                  local_1358 = (undefined1  [8])write_1.handler_;
                                  pcStack_1350 = (char *)aStack_1310._0_8_;
                                  local_1348._0_8_ = fromAddrStr._M_dataplus._M_p;
                                  local_1348._8_8_ = fromAddrStr._M_string_length;
                                  fmt_08.size_ = 0xdd;
                                  fmt_08.data_ = (char *)0x33;
                                  args_09.field_1.args_ = aVar19.args_;
                                  args_09.desc_ = (unsigned_long_long)local_1358;
                                  ::fmt::v10::vformat_abi_cxx11_
                                            ((string *)&addr,
                                             (v10 *)
                                             "[mDNS] value of TXT Key \'sq\' is invalid: {} from {}"
                                             ,fmt_08,args_09);
                                  local_12c0._0_4_ = kBadFormat;
                                  std::__cxx11::string::string
                                            ((string *)(local_12c0 + 8),(string *)&addr);
LAB_0015cc62:
                                  Error::operator=(local_1320,(Error *)local_12c0);
                                  goto LAB_0015c68e;
                                }
                                uVar5 = utils::Decode<unsigned_char>(&binaryValue);
                                *(uchar *)((long)aBorderAgent + 0x140) = uVar5;
                                uVar7 = 0x2000;
                              }
                              else {
                                bVar20 = std::operator==((string *)&write,"bb");
                                if (!bVar20) goto LAB_0015bc44;
                                if ((long)binaryValue.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)binaryValue.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start != 2) {
                                  local_1358 = (undefined1  [8])0xd0000000d;
                                  pcStack_1350 = 
                                  "[mDNS] value of TXT Key \'bb\' is invalid: {} from {}";
                                  local_1348._0_8_ = 0x33;
                                  local_1348._8_8_ = 0x200000000;
                                  pfVar17 = (format_string_checker<char> *)local_1358;
                                  local_1330 = ::fmt::v10::detail::
                                               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                                  ;
                                  local_1328 = ::fmt::v10::detail::
                                               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                                  ;
                                  pcVar8 = "[mDNS] value of TXT Key \'bb\' is invalid: {} from {}";
                                  local_1348._16_8_ = pfVar17;
                                  write_1.handler_ = pfVar17;
                                  while (pcVar8 != "") {
                                    cVar1 = *pcVar8;
                                    pcVar13 = pcVar8;
                                    while (cVar1 != '{') {
                                      pcVar13 = pcVar13 + 1;
                                      if (pcVar13 == "") {
                                        ::fmt::v10::detail::
                                        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::writer::operator()((writer *)&write_1,pcVar8,"");
                                        pfVar17 = extraout_RDX_16;
                                        goto LAB_0015cbff;
                                      }
                                      cVar1 = *pcVar13;
                                    }
                                    ::fmt::v10::detail::
                                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::writer::operator()((writer *)&write_1,pcVar8,pcVar13);
                                    pcVar8 = ::fmt::v10::detail::
                                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                                                       (pcVar13,"",
                                                        (
                                                  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_1358);
                                    pfVar17 = extraout_RDX_15;
                                  }
LAB_0015cbff:
                                  utils::Hex_abi_cxx11_
                                            ((string *)&write_1,(utils *)&binaryValue,
                                             (ByteArray *)pfVar17);
                                  local_1358 = (undefined1  [8])write_1.handler_;
                                  pcStack_1350 = (char *)aStack_1310._0_8_;
                                  local_1348._0_8_ = fromAddrStr._M_dataplus._M_p;
                                  local_1348._8_8_ = fromAddrStr._M_string_length;
                                  fmt_09.size_ = 0xdd;
                                  fmt_09.data_ = (char *)0x33;
                                  args_10.field_1.args_ = aVar19.args_;
                                  args_10.desc_ = (unsigned_long_long)local_1358;
                                  ::fmt::v10::vformat_abi_cxx11_
                                            ((string *)&addr,
                                             (v10 *)
                                             "[mDNS] value of TXT Key \'bb\' is invalid: {} from {}"
                                             ,fmt_09,args_10);
                                  local_12c0._0_4_ = kBadFormat;
                                  std::__cxx11::string::string
                                            ((string *)(local_12c0 + 8),(string *)&addr);
                                  goto LAB_0015cc62;
                                }
                                uVar6 = utils::Decode<unsigned_short>(&binaryValue);
                                *(unsigned_short *)((long)aBorderAgent + 0x142) = uVar6;
                                uVar7 = 0x4000;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      *(uint *)((long)aBorderAgent + 0x170) = *(uint *)((long)aBorderAgent + 0x170) | uVar7;
LAB_0015bc44:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&binaryValue);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&write);
      this = this + 0x20;
      aString = extraout_RDX_00;
    }
  }
  else {
    if (aType == 0x1c) {
      local_1288._M_local_buf[0] = '\0';
      write.handler_ = (format_string_checker<char> *)&local_1288;
      mdns_record_parse_aaaa(aData,aSize,aOffset,aLength,&addr);
      server.name.length._0_4_ = addr.sin6_addr.__in6_u.__u6_addr32[2];
      server.name.length._4_4_ = addr.sin6_addr.__in6_u.__u6_addr32[3];
      server._0_8_ = addr._0_8_;
      server.name.str._0_4_ = addr.sin6_addr.__in6_u.__u6_addr32[0];
      server.name.str._4_4_ = addr.sin6_addr.__in6_u.__u6_addr32[1];
      Address::Set((Error *)local_1358,&fromAddr,(sockaddr_storage *)&server);
      tVar18 = local_1358._0_4_;
      std::__cxx11::string::~string((string *)&pcStack_1350);
      if (tVar18 == none_type) {
        Address::ToString_abi_cxx11_((string *)local_1358,&fromAddr);
        std::__cxx11::string::operator=((string *)&write,(string *)local_1358);
        std::__cxx11::string::~string((string *)local_1358);
        std::__cxx11::string::_M_assign((string *)((long)aBorderAgent + 8));
        goto LAB_0015c16c;
      }
      local_1358._0_4_ = string_type;
      pcStack_1350 = "invalid IPv6 address in AAAA record from {}";
      local_1348._0_8_ = (pointer)0x2b;
      local_1348._8_8_ = 0x100000000;
      local_1330 = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar8 = "invalid IPv6 address in AAAA record from {}";
      local_1348._16_8_ = (format_string_checker<char> *)local_1358;
      write_1.handler_ = (format_string_checker<char> *)local_1358;
      while (pcVar8 != "") {
        cVar1 = *pcVar8;
        pcVar13 = pcVar8;
        while (cVar1 != '{') {
          pcVar13 = pcVar13 + 1;
          if (pcVar13 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&write_1,pcVar8,"");
            goto LAB_0015bfff;
          }
          cVar1 = *pcVar13;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&write_1,pcVar8,pcVar13);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar13,"",(format_string_checker<char> *)local_1358);
      }
LAB_0015bfff:
      local_1358 = (undefined1  [8])fromAddrStr._M_dataplus._M_p;
      pcStack_1350 = (char *)fromAddrStr._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x2b;
      args_00.field_1.args_ = aVar19.args_;
      args_00.desc_ = (unsigned_long_long)local_1358;
      ::fmt::v10::vformat_abi_cxx11_
                (&value,(v10 *)"invalid IPv6 address in AAAA record from {}",fmt,args_00);
      local_12c0._0_4_ = kBadFormat;
      std::__cxx11::string::string((string *)(local_12c0 + 8),(string *)&value);
      goto LAB_0015c0a9;
    }
    if (aType == 0xc) {
      mVar21 = mdns_record_parse_ptr(aData,aSize,aOffset,aLength,nameBuffer,0x100);
      server._0_8_ = &server.name.length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&server,mVar21.str,mVar21.str + mVar21.length);
      std::__cxx11::string::operator=((string *)((long)aBorderAgent + 0x148),(string *)&server);
      std::__cxx11::string::~string((string *)&server);
      *(undefined4 *)((long)aBorderAgent + 0x170) = 0x10000;
    }
  }
  if (*(int *)((long)aBorderAgent + 0x170) != 0) {
    tVar12 = time((time_t *)0x0);
    *(time_t *)((long)aBorderAgent + 0x168) = tVar12;
    *(byte *)((long)aBorderAgent + 0x172) = *(byte *)((long)aBorderAgent + 0x172) | 2;
  }
LAB_0015c1a5:
  std::__cxx11::string::~string((string *)&entryType);
  std::__cxx11::string::~string((string *)&fromAddrStr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fromAddr);
  return 0;
}

Assistant:

int HandleRecord(const struct sockaddr *aFrom,
                 mdns_entry_type_t      aEntry,
                 uint16_t               aType,
                 uint16_t               aRclass,
                 uint32_t               aTtl,
                 const void            *aData,
                 size_t                 aSize,
                 size_t                 aOffset,
                 size_t                 aLength,
                 void                  *aBorderAgent)
{
    struct sockaddr_storage fromAddrStorage;
    Address                 fromAddr;
    std::string             fromAddrStr;
    std::string             entryType;
    char                    nameBuffer[256];

    BorderAgentOrErrorMsg &borderAgentOrErrorMsg = *reinterpret_cast<BorderAgentOrErrorMsg *>(aBorderAgent);
    BorderAgent           &borderAgent           = borderAgentOrErrorMsg.mBorderAgent;
    Error                 &error                 = borderAgentOrErrorMsg.mError;

    (void)aRclass;
    (void)aTtl;

    *reinterpret_cast<struct sockaddr *>(&fromAddrStorage) = *aFrom;
    if (fromAddr.Set(fromAddrStorage) != ErrorCode::kNone)
    {
        ExitNow(error = ERROR_BAD_FORMAT("invalid source address of mDNS response"));
    }

    fromAddrStr = fromAddr.ToString();

    entryType = (aEntry == MDNS_ENTRYTYPE_ANSWER) ? "answer"
                                                  : ((aEntry == MDNS_ENTRYTYPE_AUTHORITY) ? "authority" : "additional");
    if (aType == MDNS_RECORDTYPE_PTR)
    {
        mdns_string_t nameStr = mdns_record_parse_ptr(aData, aSize, aOffset, aLength, nameBuffer, sizeof(nameBuffer));
        borderAgent.mServiceName  = std::string(nameStr.str, nameStr.length);
        borderAgent.mPresentFlags = BorderAgent::kServiceNameBit;
        // TODO(wgtdkp): add debug logging.
    }
    else if (aType == MDNS_RECORDTYPE_SRV)
    {
        mdns_record_srv_t server =
            mdns_record_parse_srv(aData, aSize, aOffset, aLength, nameBuffer, sizeof(nameBuffer));

        borderAgent.mPort = server.port;
        borderAgent.mPresentFlags |= BorderAgent::kPortBit;
    }
    else if (aType == MDNS_RECORDTYPE_A)
    {
        struct sockaddr_storage addrStorage;
        struct sockaddr_in      addr;
        std::string             addrStr;

        mdns_record_parse_a(aData, aSize, aOffset, aLength, &addr);

        *reinterpret_cast<struct sockaddr_in *>(&addrStorage) = addr;
        if (fromAddr.Set(addrStorage) != ErrorCode::kNone)
        {
            ExitNow(error = ERROR_BAD_FORMAT("invalid IPv4 address in A record from {}", fromAddrStr));
        }

        addrStr = fromAddr.ToString();

        // We prefer AAAA (IPv6) address than A (IPv4) address.
        if (!(borderAgent.mPresentFlags & BorderAgent::kAddrBit))
        {
            borderAgent.mAddr = addrStr;
            borderAgent.mPresentFlags |= BorderAgent::kAddrBit;
        }
    }
    else if (aType == MDNS_RECORDTYPE_AAAA)
    {
        struct sockaddr_storage addrStorage;
        struct sockaddr_in6     addr;
        std::string             addrStr;

        mdns_record_parse_aaaa(aData, aSize, aOffset, aLength, &addr);

        *reinterpret_cast<struct sockaddr_in6 *>(&addrStorage) = addr;
        if (fromAddr.Set(addrStorage) != ErrorCode::kNone)
        {
            ExitNow(error = ERROR_BAD_FORMAT("invalid IPv6 address in AAAA record from {}", fromAddrStr));
        }

        addrStr = fromAddr.ToString();

        borderAgent.mAddr = addrStr;
        borderAgent.mPresentFlags |= BorderAgent::kAddrBit;
    }
    else if (aType == MDNS_RECORDTYPE_TXT)
    {
        mdns_record_txt_t txtBuffer[128];
        size_t            parsed;

        parsed = mdns_record_parse_txt(aData, aSize, aOffset, aLength, txtBuffer,
                                       sizeof(txtBuffer) / sizeof(mdns_record_txt_t));

        for (size_t i = 0; i < parsed; ++i)
        {
            auto key         = ToString(txtBuffer[i].key);
            auto value       = ToString(txtBuffer[i].value);
            auto binaryValue = ToByteArray(txtBuffer[i].value);

            if (key == "rv")
            {
                VerifyOrExit(value == "1", error = ERROR_BAD_FORMAT("value of TXT Key 'rv' is {} but not 1 from {}",
                                                                    value, fromAddrStr));
            }
            else if (key == "dd")
            {
                auto &discriminator = binaryValue;

                if (discriminator.size() != kExtendedAddrLength)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'dd' is invalid: value={}",
                                                     utils::Hex(discriminator)));
                }
                else
                {
                    borderAgent.mDiscriminator = discriminator;
                    borderAgent.mPresentFlags |= BorderAgent::kDiscriminatorBit;
                }
            }
            else if (key == "tv")
            {
                borderAgent.mThreadVersion = value;
                borderAgent.mPresentFlags |= BorderAgent::kThreadVersionBit;
            }
            else if (key == "sb")
            {
                auto &bitmap = binaryValue;
                if (bitmap.size() != 4)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'sb' is invalid: value={} from {}",
                                                     utils::Hex(bitmap), fromAddrStr));
                }

                borderAgent.mState.mConnectionMode = (bitmap[3] & 0x07);
                borderAgent.mState.mThreadIfStatus = (bitmap[3] & 0x18) >> 3;
                borderAgent.mState.mAvailability   = (bitmap[3] & 0x60) >> 5;
                borderAgent.mState.mBbrIsActive    = (bitmap[3] & 0x80) >> 7;
                borderAgent.mState.mBbrIsPrimary   = (bitmap[2] & 0x01);
                borderAgent.mPresentFlags |= BorderAgent::kStateBit;
            }
            else if (key == "nn")
            {
                borderAgent.mNetworkName = value;
                borderAgent.mPresentFlags |= BorderAgent::kNetworkNameBit;
            }
            else if (key == "xp")
            {
                auto &extendPanId = binaryValue;
                if (extendPanId.size() != 8)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'xp' is invalid: value={} from {}",
                                                     utils::Hex(extendPanId), fromAddrStr));
                }
                else
                {
                    borderAgent.mExtendedPanId = utils::Decode<uint64_t>(extendPanId);
                    borderAgent.mPresentFlags |= BorderAgent::kExtendedPanIdBit;
                }
            }
            else if (key == "vn")
            {
                borderAgent.mVendorName = value;
                borderAgent.mPresentFlags |= BorderAgent::kVendorNameBit;
            }
            else if (key == "mn")
            {
                borderAgent.mModelName = value;
                borderAgent.mPresentFlags |= BorderAgent::kModelNameBit;
            }
            else if (key == "at")
            {
                auto &activeTimestamp = binaryValue;
                if (activeTimestamp.size() != 8)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'at' is invalid: value={} from {}",
                                                     utils::Hex(activeTimestamp), fromAddrStr));
                }
                else
                {
                    borderAgent.mActiveTimestamp = Timestamp::Decode(utils::Decode<uint64_t>(activeTimestamp));
                    borderAgent.mPresentFlags |= BorderAgent::kActiveTimestampBit;
                }
            }
            else if (key == "pt")
            {
                auto &partitionId = binaryValue;
                if (partitionId.size() != 4)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'pt' is invalid: value={} from {}",
                                                     utils::Hex(partitionId), fromAddrStr));
                }
                else
                {
                    borderAgent.mPartitionId = utils::Decode<uint32_t>(partitionId);
                    borderAgent.mPresentFlags |= BorderAgent::kPartitionIdBit;
                }
            }
            else if (key == "vd")
            {
                borderAgent.mVendorData = value;
                borderAgent.mPresentFlags |= BorderAgent::kVendorDataBit;
            }
            else if (key == "vo")
            {
                auto &oui = binaryValue;
                if (oui.size() != 3)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("value of TXT Key 'vo' is invalid: value={} from {}",
                                                     utils::Hex(oui), fromAddrStr));
                }
                else
                {
                    borderAgent.mVendorOui = oui;
                    borderAgent.mPresentFlags |= BorderAgent::kVendorOuiBit;
                }
            }
            else if (key == "dn")
            {
                borderAgent.mDomainName = value;
                borderAgent.mPresentFlags |= BorderAgent::kDomainNameBit;
            }
            else if (key == "sq")
            {
                auto &bbrSeqNum = binaryValue;
                if (bbrSeqNum.size() != 1)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("[mDNS] value of TXT Key 'sq' is invalid: {} from {}",
                                                     utils::Hex(bbrSeqNum), fromAddrStr));
                }
                else
                {
                    borderAgent.mBbrSeqNumber = utils::Decode<uint8_t>(bbrSeqNum);
                    borderAgent.mPresentFlags |= BorderAgent::kBbrSeqNumberBit;
                }
            }
            else if (key == "bb")
            {
                auto &bbrPort = binaryValue;
                if (bbrPort.size() != 2)
                {
                    ExitNow(error = ERROR_BAD_FORMAT("[mDNS] value of TXT Key 'bb' is invalid: {} from {}",
                                                     utils::Hex(bbrPort), fromAddrStr));
                }
                else
                {
                    borderAgent.mBbrPort = utils::Decode<uint16_t>(bbrPort);
                    borderAgent.mPresentFlags |= BorderAgent::kBbrPortBit;
                }
            }
            else
            {
                // TODO(wgtdkp): add debug logging.
            }
        }
    }
    else
    {
        // TODO(wgtdkp): add debug logging.
    }

    if (borderAgent.mPresentFlags != 0)
    {
        // Actualize Timestamp
        borderAgent.mUpdateTimestamp.mTime = time(nullptr);
        borderAgent.mPresentFlags |= BorderAgent::kUpdateTimestampBit;
    }
exit:
    return 0;
}